

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# forestdb.cc
# Opt level: O0

fdb_status fdb_cancel_compaction(fdb_file_handle *fhandle)

{
  file_status_t fVar1;
  long in_RDI;
  file_status_t fstatus;
  uint sleep_time;
  fdb_kvs_handle *super_handle;
  uint in_stack_ffffffffffffffdc;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 uVar2;
  undefined4 in_stack_ffffffffffffffe4;
  undefined4 uVar3;
  undefined4 local_4;
  
  if (in_RDI == 0) {
    local_4 = FDB_RESULT_INVALID_HANDLE;
  }
  else {
    filemgr_mutex_lock((filemgr *)0x1484f9);
    filemgr_set_cancel_compaction
              ((filemgr *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
               SUB41(in_stack_ffffffffffffffdc >> 0x18,0));
    uVar3 = 10000;
    fVar1 = filemgr_get_file_status((filemgr *)0x148522);
    for (uVar2 = CONCAT13(fVar1,(int3)in_stack_ffffffffffffffe0);
        (char)((uint)uVar2 >> 0x18) == '\x01'; uVar2 = CONCAT13(fVar1,(int3)uVar2)) {
      filemgr_mutex_unlock((filemgr *)0x14853e);
      decaying_usleep((uint *)CONCAT44(uVar3,uVar2),in_stack_ffffffffffffffdc);
      filemgr_mutex_lock((filemgr *)0x14855b);
      fVar1 = filemgr_get_file_status((filemgr *)0x148569);
    }
    filemgr_set_cancel_compaction
              ((filemgr *)CONCAT44(uVar3,uVar2),SUB41(in_stack_ffffffffffffffdc >> 0x18,0));
    filemgr_mutex_unlock((filemgr *)0x14858d);
    local_4 = FDB_RESULT_SUCCESS;
  }
  return local_4;
}

Assistant:

LIBFDB_API
fdb_status fdb_cancel_compaction(fdb_file_handle *fhandle)
{
    if (!fhandle) {
        return FDB_RESULT_INVALID_HANDLE;
    }

    fdb_kvs_handle *super_handle = fhandle->root;

    filemgr_mutex_lock(super_handle->file);
    filemgr_set_cancel_compaction(super_handle->file, true);

    // TODO: Find a better way of cacncelling the ongoing compaction task.
    unsigned int sleep_time = 10000; // 10 ms.
    file_status_t fstatus = filemgr_get_file_status(super_handle->file);
    while (fstatus == FILE_COMPACT_OLD) {
        filemgr_mutex_unlock(super_handle->file);
        decaying_usleep(&sleep_time, 1000000);
        filemgr_mutex_lock(super_handle->file);
        fstatus = filemgr_get_file_status(super_handle->file);
    }
    filemgr_set_cancel_compaction(super_handle->file, false);
    filemgr_mutex_unlock(super_handle->file);
    return FDB_RESULT_SUCCESS;
}